

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_factory.cpp
# Opt level: O0

MemBankList *
n_e_s::core::MemBankFactory::create_nes_ppu_mem_banks(MemBankList *__return_storage_ptr__,IRom *rom)

{
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>_>_>
  local_50;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_48 [3];
  unique_ptr<n_e_s::core::(anonymous_namespace)::PpuRomTranslator,_std::default_delete<n_e_s::core::(anonymous_namespace)::PpuRomTranslator>_>
  local_30;
  unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> local_28;
  undefined1 local_19;
  IRom *local_18;
  IRom *rom_local;
  MemBankList *mem_banks;
  
  local_19 = 0;
  local_18 = rom;
  rom_local = (IRom *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::vector(__return_storage_ptr__);
  std::make_unique<n_e_s::core::(anonymous_namespace)::PpuRomTranslator,n_e_s::core::IRom*&>
            ((IRom **)&local_30);
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::(anonymous_namespace)::PpuRomTranslator,std::default_delete<n_e_s::core::(anonymous_namespace)::PpuRomTranslator>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             &local_28,&local_30);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&local_28);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (&local_28);
  std::
  unique_ptr<n_e_s::core::(anonymous_namespace)::PpuRomTranslator,_std::default_delete<n_e_s::core::(anonymous_namespace)::PpuRomTranslator>_>
  ::~unique_ptr(&local_30);
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)16128,(unsigned_short)16383,(unsigned_short)32>>
            ();
  std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16128,(unsigned_short)16383,(unsigned_short)32>,std::default_delete<n_e_s::core::MemBank<(unsigned_short)16128,(unsigned_short)16383,(unsigned_short)32>>,void>
            ((unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>> *)
             local_48,&local_50);
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_48);
  std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>::~unique_ptr
            (local_48);
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>_>_>
  ::~unique_ptr(&local_50);
  return __return_storage_ptr__;
}

Assistant:

MemBankList MemBankFactory::create_nes_ppu_mem_banks(IRom *rom) {
    MemBankList mem_banks;

    // Rom, make sure this is first so the mapper can decide if it wants to
    // handle the address or not.
    mem_banks.push_back(std::make_unique<PpuRomTranslator>(rom));

    // Palettes
    mem_banks.push_back(std::make_unique<MemBank<0x3F00, 0x3FFF, 0x20>>());

    return mem_banks;
}